

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_935bd6::HandleCreateLinkCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *__rhs;
  pointer pbVar1;
  cmMakefile *this;
  __type _Var2;
  bool bVar3;
  int iVar4;
  Status SVar5;
  ostream *poVar6;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view name;
  static_string_view name_00;
  static_string_view name_01;
  _Any_data local_288;
  code *local_278;
  code *local_270;
  Status linked;
  string result;
  Arguments arguments;
  string local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unconsumedArgs;
  Status copied;
  ostringstream e;
  _Any_data local_168;
  _Manager_type local_158;
  pointer ppStack_150;
  pointer local_148;
  pointer ppStack_140;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"CREATE_LINK must be called with at least two additional arguments",
               (allocator<char> *)local_288._M_pod_data);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&e);
    return false;
  }
  if (((anonymous_namespace)::
       HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar4 != 0)) {
    local_148 = (pointer)0x0;
    ppStack_140 = (pointer)0x0;
    local_158 = (_Manager_type)0x0;
    ppStack_150 = (pointer)0x0;
    local_168._0_8_ = 0;
    local_168._8_8_ = 0;
    _e = (cmArgumentParser<Arguments> *)0x0;
    local_288._M_unused._M_object = (void *)0x0;
    local_288._8_8_ = 0;
    local_270 = std::
                _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
                ::_M_invoke;
    local_278 = std::
                _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
                ::_M_manager;
    name._M_str = "RESULT";
    name._M_len = 6;
    ArgumentParser::Base::Bind((Base *)&e,name,(KeywordAction *)&local_288);
    std::_Function_base::~_Function_base((_Function_base *)&local_288);
    name_00.super_string_view._M_str = "COPY_ON_ERROR";
    name_00.super_string_view._M_len = 0xd;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)&e,name_00,0x20);
    name_01.super_string_view._M_str = "SYMBOLIC";
    name_01.super_string_view._M_len = 8;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)&e,name_01,0x21);
    ArgumentParser::ActionMap::ActionMap
              ((ActionMap *)&HandleCreateLinkCommand::parser,(ActionMap *)&e);
    ArgumentParser::ActionMap::~ActionMap((ActionMap *)&e);
    __cxa_atexit(ArgumentParser::Base::~Base,&HandleCreateLinkCommand::parser,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  unconsumedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unconsumedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unconsumedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288._8_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  arguments.Result._M_dataplus._M_p = (pointer)&arguments.Result.field_2;
  arguments.Result._M_string_length = 0;
  local_288._M_unused._M_object =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 3;
  arguments.Result.field_2._M_local_buf[0] = '\0';
  arguments.CopyOnError = false;
  arguments.Symbolic = false;
  _e = &HandleCreateLinkCommand::parser;
  local_168._0_8_ = 0;
  local_168._8_8_ = 0;
  local_158 = (_Manager_type)0x0;
  ppStack_150 = (pointer)0x0;
  local_148 = (pointer)((ulong)local_148 & 0xffffffffffffff00);
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)&e,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&local_288,0);
  std::_Function_base::~_Function_base((_Function_base *)&local_168);
  if (unconsumedArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      unconsumedArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_288,
                   "unknown argument: \"",
                   unconsumedArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_288,
                   '\"');
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::~string((string *)local_288._M_pod_data);
    bVar3 = false;
    goto LAB_0027f775;
  }
  __lhs = pbVar1 + 1;
  __rhs = pbVar1 + 2;
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  _Var2 = std::operator==(__lhs,__rhs);
  if (_Var2) {
    std::__cxx11::string::assign((char *)&result);
LAB_0027f3b2:
    if (arguments.Result._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_0027f4d7:
      bVar3 = false;
    }
    else {
      bVar3 = true;
      value._M_str = result._M_dataplus._M_p;
      value._M_len = result._M_string_length;
      cmMakefile::AddDefinition(status->Makefile,&arguments.Result,value);
    }
  }
  else {
    if ((arguments.Symbolic == false) && (bVar3 = cmsys::SystemTools::FileExists(__lhs), !bVar3)) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_288
                     ,"Cannot hard link \'",__lhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_288
                     ,"\' as it does not exist.");
      std::__cxx11::string::operator=((string *)&result,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::string::~string((string *)local_288._M_pod_data);
      goto LAB_0027f3b2;
    }
    bVar3 = cmsys::SystemTools::FileExists(__rhs);
    if (((!bVar3) && (bVar3 = cmsys::SystemTools::FileIsSymlink(__rhs), !bVar3)) ||
       (SVar5 = cmsys::SystemTools::RemoveFile(__rhs), SVar5.Kind_ == Success)) {
      if (arguments.Symbolic == true) {
        linked = cmSystemTools::CreateSymlinkQuietly(__lhs,__rhs);
        if (linked.Kind_ == Success) goto LAB_0027f66d;
        _e = (cmArgumentParser<Arguments> *)0x20;
        local_288._8_8_ = pbVar1[2]._M_dataplus._M_p;
        local_288._M_unused._0_8_ = (undefined8)pbVar1[2]._M_string_length;
        cmsys::Status::GetString_abi_cxx11_(&local_208,&linked);
        cmStrCat<char[4],std::__cxx11::string>
                  ((string *)&copied,(cmAlphaNum *)&e,(cmAlphaNum *)&local_288,
                   (char (*) [4])0x5e074f,&local_208);
LAB_0027f63f:
        std::__cxx11::string::operator=((string *)&result,(string *)&copied);
        std::__cxx11::string::~string((string *)&copied);
        std::__cxx11::string::~string((string *)&local_208);
        bVar3 = false;
      }
      else {
        linked = cmSystemTools::CreateLinkQuietly(__lhs,__rhs);
        if (linked.Kind_ != Success) {
          _e = (cmArgumentParser<Arguments> *)0x17;
          local_288._8_8_ = pbVar1[2]._M_dataplus._M_p;
          local_288._M_unused._0_8_ = (undefined8)pbVar1[2]._M_string_length;
          cmsys::Status::GetString_abi_cxx11_(&local_208,&linked);
          cmStrCat<char[4],std::__cxx11::string>
                    ((string *)&copied,(cmAlphaNum *)&e,(cmAlphaNum *)&local_288,
                     (char (*) [4])0x5e074f,&local_208);
          goto LAB_0027f63f;
        }
LAB_0027f66d:
        bVar3 = true;
      }
      if ((!bVar3) && (arguments.CopyOnError == true)) {
        copied = cmsys::SystemTools::CopyFileAlways(__lhs,__rhs);
        if (copied.Kind_ == Success) {
          bVar3 = true;
        }
        else {
          cmsys::Status::GetString_abi_cxx11_((string *)&local_288,&copied);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                         "Copy failed: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_288);
          std::__cxx11::string::operator=((string *)&result,(string *)&e);
          std::__cxx11::string::~string((string *)&e);
          std::__cxx11::string::~string((string *)local_288._M_pod_data);
        }
      }
      if (bVar3) {
        std::__cxx11::string::assign((char *)&result);
        if (arguments.Result._M_string_length == 0) {
          bVar3 = true;
        }
        else {
LAB_0027f751:
          bVar3 = true;
          value_01._M_str = result._M_dataplus._M_p;
          value_01._M_len = result._M_string_length;
          cmMakefile::AddDefinition(status->Makefile,&arguments.Result,value_01);
        }
        goto LAB_0027f76b;
      }
      if (arguments.Result._M_string_length != 0) goto LAB_0027f751;
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_0027f4d7;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar6 = std::operator<<((ostream *)&e,"Failed to create link \'");
    poVar6 = std::operator<<(poVar6,(string *)__rhs);
    poVar6 = std::operator<<(poVar6,"\' because existing path cannot be removed: ");
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    poVar6 = std::operator<<(poVar6,(string *)local_288._M_pod_data);
    std::operator<<(poVar6,"\n");
    std::__cxx11::string::~string((string *)local_288._M_pod_data);
    bVar3 = arguments.Result._M_string_length != 0;
    if (arguments.Result._M_string_length == 0) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
      this = status->Makefile;
      std::__cxx11::stringbuf::str();
      value_00._M_str = (char *)local_288._M_unused._0_8_;
      value_00._M_len = local_288._8_8_;
      cmMakefile::AddDefinition(this,&arguments.Result,value_00);
    }
    std::__cxx11::string::~string((string *)local_288._M_pod_data);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
LAB_0027f76b:
  std::__cxx11::string::~string((string *)&result);
LAB_0027f775:
  std::__cxx11::string::~string((string *)&arguments);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unconsumedArgs);
  return bVar3;
}

Assistant:

bool HandleCreateLinkCommand(std::vector<std::string> const& args,
                             cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("CREATE_LINK must be called with at least two additional "
                    "arguments");
    return false;
  }

  std::string const& fileName = args[1];
  std::string const& newFileName = args[2];

  struct Arguments
  {
    std::string Result;
    bool CopyOnError = false;
    bool Symbolic = false;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("RESULT"_s, &Arguments::Result)
      .Bind("COPY_ON_ERROR"_s, &Arguments::CopyOnError)
      .Bind("SYMBOLIC"_s, &Arguments::Symbolic);

  std::vector<std::string> unconsumedArgs;
  Arguments const arguments =
    parser.Parse(cmMakeRange(args).advance(3), &unconsumedArgs);

  if (!unconsumedArgs.empty()) {
    status.SetError("unknown argument: \"" + unconsumedArgs.front() + '\"');
    return false;
  }

  // The system error message generated in the operation.
  std::string result;

  // Check if the paths are distinct.
  if (fileName == newFileName) {
    result = "CREATE_LINK cannot use same file and newfile";
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, result);
      return true;
    }
    status.SetError(result);
    return false;
  }

  // Hard link requires original file to exist.
  if (!arguments.Symbolic && !cmSystemTools::FileExists(fileName)) {
    result = "Cannot hard link \'" + fileName + "\' as it does not exist.";
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, result);
      return true;
    }
    status.SetError(result);
    return false;
  }

  // Check if the new file already exists and remove it.
  if ((cmSystemTools::FileExists(newFileName) ||
       cmSystemTools::FileIsSymlink(newFileName)) &&
      !cmSystemTools::RemoveFile(newFileName)) {
    std::ostringstream e;
    e << "Failed to create link '" << newFileName
      << "' because existing path cannot be removed: "
      << cmSystemTools::GetLastSystemError() << "\n";

    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, e.str());
      return true;
    }
    status.SetError(e.str());
    return false;
  }

  // Whether the operation completed successfully.
  bool completed = false;

  // Check if the command requires a symbolic link.
  if (arguments.Symbolic) {
    cmsys::Status linked =
      cmSystemTools::CreateSymlinkQuietly(fileName, newFileName);
    if (linked) {
      completed = true;
    } else {
      result = cmStrCat("failed to create symbolic link '", newFileName,
                        "': ", linked.GetString());
    }
  } else {
    cmsys::Status linked =
      cmSystemTools::CreateLinkQuietly(fileName, newFileName);
    if (linked) {
      completed = true;
    } else {
      result = cmStrCat("failed to create link '", newFileName,
                        "': ", linked.GetString());
    }
  }

  // Check if copy-on-error is enabled in the arguments.
  if (!completed && arguments.CopyOnError) {
    cmsys::Status copied =
      cmsys::SystemTools::CopyFileAlways(fileName, newFileName);
    if (copied) {
      completed = true;
    } else {
      result = "Copy failed: " + copied.GetString();
    }
  }

  // Check if the operation was successful.
  if (completed) {
    result = "0";
  } else if (arguments.Result.empty()) {
    // The operation failed and the result is not reported in a variable.
    status.SetError(result);
    return false;
  }

  if (!arguments.Result.empty()) {
    status.GetMakefile().AddDefinition(arguments.Result, result);
  }

  return true;
}